

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O2

void copy_brands(_Bool **dest,_Bool *source)

{
  byte bVar1;
  brand_conflict *pbVar2;
  int iVar3;
  _Bool *p_Var4;
  _Bool *p_Var5;
  ulong uVar6;
  _Bool *p_Var7;
  long lVar8;
  long lVar9;
  
  if (source != (_Bool *)0x0) {
    p_Var4 = *dest;
    if (p_Var4 == (_Bool *)0x0) {
      p_Var4 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
      *dest = p_Var4;
    }
    bVar1 = z_info->brand_max;
    for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
      p_Var4[uVar6] = (_Bool)(p_Var4[uVar6] | source[uVar6]);
    }
    lVar9 = 0;
    for (uVar6 = 0; pbVar2 = brands, uVar6 != bVar1; uVar6 = uVar6 + 1) {
      p_Var7 = p_Var4;
      for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 0x30) {
        if (((p_Var4[uVar6] == true) && (*p_Var7 == true)) &&
           (iVar3 = strcmp(pbVar2[uVar6].name,*(char **)((long)&pbVar2->name + lVar8)), iVar3 == 0))
        {
          p_Var5 = p_Var7;
          if (pbVar2[uVar6].multiplier < *(int *)((long)&pbVar2->multiplier + lVar8)) {
            p_Var5 = p_Var4 + uVar6;
          }
          *p_Var5 = false;
        }
        p_Var7 = p_Var7 + 1;
      }
      lVar9 = lVar9 + 0x30;
    }
  }
  return;
}

Assistant:

void copy_brands(bool **dest, bool *source)
{
	int i, j;

	/* Check structures */
	if (!source) return;
	if (!(*dest))
		*dest = mem_zalloc(z_info->brand_max * sizeof(bool));

	/* Copy */
	for (i = 0; i < z_info->brand_max; i++)
		(*dest)[i] |= source[i];

	/* Check for duplicates */
	for (i = 0; i < z_info->brand_max; i++) {
		for (j = 0; j < i; j++) {
			if ((*dest)[i] && (*dest)[j] &&
				streq(brands[i].name, brands[j].name)) {
				if (brands[i].multiplier < brands[j].multiplier) {
					(*dest)[i] = false;
				} else {
					(*dest)[j] = false;
				}
			}
		}
	}
}